

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O1

Node * __thiscall
dynet::ScalarInputNode::autobatch_pseudo_node
          (ScalarInputNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  pointer puVar1;
  pointer puVar2;
  pointer ppNVar3;
  InputNode *this_00;
  long lVar4;
  long lVar5;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> local_50;
  Dim local_34;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_50,
             (long)(batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_34);
  puVar1 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar2 - (long)puVar1 >> 2;
  if (puVar2 != puVar1) {
    ppNVar3 = (cg->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = **(float **)((long)ppNVar3[puVar1[lVar4]][1].dim.d + 8);
      lVar4 = lVar4 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  this_00 = (InputNode *)operator_new(0xa8);
  local_34.bd = (uint)lVar5;
  local_34.nd = 1;
  local_34.d[0] = 1;
  InputNode::InputNode(this_00,&local_34,&local_50);
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return &this_00->super_Node;
}

Assistant:

Node* ScalarInputNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                             const std::vector<VariableIndex> & batch_ids) const {
  vector<float> values(batch_ids.size());
  ScalarInputNode* sin;
  for(size_t i = 0; i < batch_ids.size(); ++i) {
    sin = static_cast<ScalarInputNode*>(cg.nodes[batch_ids[i]]);
    values[i] = *sin->pdata;
  }
  return new InputNode(Dim({1}, batch_ids.size()), values);
}